

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O0

int hd_deflate_decide_indexing(nghttp2_hd_deflater *deflater,nghttp2_nv *nv,int32_t token)

{
  size_t sVar1;
  int32_t token_local;
  nghttp2_nv *nv_local;
  nghttp2_hd_deflater *deflater_local;
  
  if ((((((token != 3) && (token != 0x14)) && (token != 0x1b)) &&
       ((token != 0x21 && (token != 0x27)))) &&
      ((token != 0x28 && ((token != 0x2d && (token != 0x36)))))) &&
     (sVar1 = entry_room(nv->namelen,nv->valuelen),
     sVar1 <= (deflater->ctx).hd_table_bufsize_max * 3 >> 2)) {
    return 0;
  }
  return 1;
}

Assistant:

static int hd_deflate_decide_indexing(nghttp2_hd_deflater *deflater,
                                      const nghttp2_nv *nv, int32_t token) {
  if (token == NGHTTP2_TOKEN__PATH || token == NGHTTP2_TOKEN_AGE ||
      token == NGHTTP2_TOKEN_CONTENT_LENGTH || token == NGHTTP2_TOKEN_ETAG ||
      token == NGHTTP2_TOKEN_IF_MODIFIED_SINCE ||
      token == NGHTTP2_TOKEN_IF_NONE_MATCH || token == NGHTTP2_TOKEN_LOCATION ||
      token == NGHTTP2_TOKEN_SET_COOKIE ||
      entry_room(nv->namelen, nv->valuelen) >
          deflater->ctx.hd_table_bufsize_max * 3 / 4) {
    return NGHTTP2_HD_WITHOUT_INDEXING;
  }

  return NGHTTP2_HD_WITH_INDEXING;
}